

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O0

Error __thiscall
asmjit::v1_14::String::_opVFormat(String *this,ModifyOp op,char *fmt,__va_list_tag *ap)

{
  undefined8 uVar1;
  Error EVar2;
  int iVar3;
  ulong uVar4;
  char *__s;
  undefined8 *in_RCX;
  char *in_RDX;
  int in_ESI;
  String *in_RDI;
  char *p;
  va_list apCopy;
  size_t outputSize;
  int fmtResult;
  char buf [1024];
  size_t remainingCapacity;
  size_t startAt;
  String *local_4e0;
  size_t size;
  ulong in_stack_fffffffffffffb40;
  ModifyOp MVar5;
  String *in_stack_fffffffffffffb48;
  ulong local_4b0;
  size_t in_stack_fffffffffffffb60;
  undefined1 local_498 [4];
  String *this_00;
  ulong local_478;
  int local_46c;
  char local_468 [888];
  char *in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff1c;
  char *in_stack_ffffffffffffff20;
  Error local_34;
  
  if (in_ESI == 0) {
    local_4b0 = 0;
  }
  else {
    in_stack_fffffffffffffb48 = in_RDI;
    if ((byte)*in_RDI < 0x1f) {
      in_stack_fffffffffffffb40 = (ulong)(byte)*in_RDI;
      local_4b0 = in_stack_fffffffffffffb40;
    }
    else {
      in_stack_fffffffffffffb40 = *(ulong *)(in_RDI + 8);
      local_4b0 = in_stack_fffffffffffffb40;
    }
  }
  MVar5 = (ModifyOp)(in_stack_fffffffffffffb40 >> 0x20);
  if ((byte)*in_RDI < 0x1f) {
    size = 0x1e;
  }
  else {
    size = *(size_t *)(in_RDI + 0x10);
  }
  uVar4 = size - local_4b0;
  _local_498 = *in_RCX;
  this_00 = (String *)in_RCX[1];
  if (uVar4 < 0x80) {
    local_46c = vsnprintf(local_468,0x400,in_RDX,in_RCX);
    local_478 = (ulong)local_46c;
    if (local_478 < 0x400) {
      EVar2 = _opString(in_stack_fffffffffffffb48,MVar5,(char *)in_RDI,size);
      return EVar2;
    }
  }
  else {
    if ((byte)*in_RDI < 0x1f) {
      local_4e0 = in_RDI + 1;
    }
    else {
      local_4e0 = *(String **)(in_RDI + 0x18);
    }
    local_46c = vsnprintf((char *)(local_4e0 + local_4b0),uVar4,in_RDX,in_RCX);
    local_478 = (ulong)local_46c;
    if (local_478 <= uVar4) {
      _setSize(in_RDI,local_4b0 + local_478);
      return 0;
    }
  }
  uVar1 = _local_498;
  if (local_46c < 0) {
    local_34 = DebugUtils::errored(3);
  }
  else {
    uVar4 = (ulong)_local_498 >> 0x20;
    MVar5 = (ModifyOp)uVar4;
    _local_498 = uVar1;
    __s = prepare(this_00,MVar5,in_stack_fffffffffffffb60);
    if (__s == (char *)0x0) {
      local_34 = DebugUtils::errored(1);
    }
    else {
      iVar3 = vsnprintf(__s,local_478 + 1,in_RDX,local_498);
      if ((long)iVar3 != local_478) {
        DebugUtils::assertionFailed
                  (in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,in_stack_ffffffffffffff10);
      }
      local_34 = 0;
    }
  }
  return local_34;
}

Assistant:

Error String::_opVFormat(ModifyOp op, const char* fmt, va_list ap) noexcept {
  size_t startAt = (op == ModifyOp::kAssign) ? size_t(0) : size();
  size_t remainingCapacity = capacity() - startAt;

  char buf[1024];
  int fmtResult;
  size_t outputSize;

  va_list apCopy;
  va_copy(apCopy, ap);

  if (remainingCapacity >= 128) {
    fmtResult = vsnprintf(data() + startAt, remainingCapacity, fmt, ap);
    outputSize = size_t(fmtResult);

    if (ASMJIT_LIKELY(outputSize <= remainingCapacity)) {
      _setSize(startAt + outputSize);
      return kErrorOk;
    }
  }
  else {
    fmtResult = vsnprintf(buf, ASMJIT_ARRAY_SIZE(buf), fmt, ap);
    outputSize = size_t(fmtResult);

    if (ASMJIT_LIKELY(outputSize < ASMJIT_ARRAY_SIZE(buf)))
      return _opString(op, buf, outputSize);
  }

  if (ASMJIT_UNLIKELY(fmtResult < 0))
    return DebugUtils::errored(kErrorInvalidState);

  char* p = prepare(op, outputSize);
  if (ASMJIT_UNLIKELY(!p))
    return DebugUtils::errored(kErrorOutOfMemory);

  fmtResult = vsnprintf(p, outputSize + 1, fmt, apCopy);
  ASMJIT_ASSERT(size_t(fmtResult) == outputSize);

  return kErrorOk;
}